

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void error<Token,Token>(char *fmtstr,Token *args,Token *args_1)

{
  String SStack_58;
  String local_38;
  
  String::String(&local_38,fmtstr);
  format<Token,Token>(&SStack_58,&local_38,args,args_1);
  error(&SStack_58);
  std::__cxx11::string::~string((string *)&SStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}